

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_chill(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined1 in_stack_000012c2;
  undefined1 in_stack_000012c3;
  int in_stack_000012c4;
  int in_stack_000012c8;
  int in_stack_000012cc;
  CHAR_DATA *in_stack_000012d0;
  CHAR_DATA *in_stack_000012d8;
  int in_stack_000012f8;
  int in_stack_00001300;
  char *in_stack_00001308;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  int in_stack_ffffffffffffff90;
  
  act(in_stack_ffffffffffffff60,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
      (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
      (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
  dice(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  bVar1 = saves_spell(in_stack_ffffffffffffff90,
                      (CHAR_DATA *)
                      CONCAT26(in_stack_ffffffffffffff8e,
                               CONCAT24(in_stack_ffffffffffffff8c,
                                        CONCAT22(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88
                                                ))),in_stack_ffffffffffffff84);
  if (bVar1) {
    damage_new(in_stack_000012d8,in_stack_000012d0,in_stack_000012cc,in_stack_000012c8,
               in_stack_000012c4,(bool)in_stack_000012c3,(bool)in_stack_000012c2,in_stack_000012f8,
               in_stack_00001300,in_stack_00001308);
  }
  else {
    init_affect((AFFECT_DATA *)0x6d40f8);
    bVar1 = is_affected(in_RCX,(int)gsn_chill);
    if (bVar1) {
      affect_join((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    else {
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    act(in_stack_ffffffffffffff60,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
        (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    act(in_stack_ffffffffffffff60,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
        (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
        (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    damage_new(in_stack_000012d8,in_stack_000012d0,in_stack_000012cc,in_stack_000012c8,
               in_stack_000012c4,(bool)in_stack_000012c3,(bool)in_stack_000012c2,in_stack_000012f8,
               in_stack_00001300,in_stack_00001308);
  }
  return;
}

Assistant:

void spell_chill(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	act("You draw the heat out of $N's flesh, chilling $M.", ch, 0, victim, TO_CHAR);

	int dam = dice(5, 4) + level;

	if (!saves_spell(level, victim, DAM_COLD))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_STR;
		af.owner = ch;
		af.duration = 10;
		af.level = level;
		af.modifier = -2;

		if (is_affected(victim, gsn_chill))
			affect_join(victim, &af);
		else
			affect_to_char(victim, &af);

		act("$n's flesh turns purple as he shivers!", victim, 0, ch, TO_ROOM);
		act("You begin shivering violently.", 0, 0, victim, TO_VICT);
		damage_new(ch, victim, dam, TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "chill");
	}
	else
	{
		dam /= 2;
		damage_new(ch, victim, dam, TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "chill");
	}
}